

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t secp256k1_read_be32(uchar *p)

{
  uchar *p_local;
  
  return (uint)*p << 0x18 | (uint)p[1] << 0x10 | (uint)p[2] << 8 | (uint)p[3];
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_read_be32(const unsigned char* p) {
    return (uint32_t)p[0] << 24 |
           (uint32_t)p[1] << 16 |
           (uint32_t)p[2] << 8  |
           (uint32_t)p[3];
}